

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall adios2::transport::FilePOSIX::CheckFile(FilePOSIX *this,string *hint)

{
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (this->m_FileDescriptor == -1) {
    std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_b1);
    std::__cxx11::string::string((string *)&local_50,"transport::file::FilePOSIX",&local_b2);
    std::__cxx11::string::string((string *)&local_70,"CheckFile",&local_b3);
    SysErrMsg_abi_cxx11_(&local_b0,this);
    std::operator+(&local_90,hint,&local_b0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void FilePOSIX::CheckFile(const std::string hint) const
{
    if (m_FileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "CheckFile",
                                              hint + SysErrMsg());
    }
}